

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void hexdump(char *data,char *mask,size_t len)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  char *local_60;
  
  iVar3 = (int)len;
  uVar6 = 0;
  do {
    uVar5 = (uint)uVar6;
    printf("#%07x: ",uVar6);
    lVar4 = (long)(int)uVar5;
    local_60 = data + lVar4;
    pcVar7 = mask + lVar4;
    lVar9 = 0;
    iVar10 = 0;
    do {
      lVar8 = 0;
      do {
        cVar1 = '\n';
        if (lVar4 + lVar8 < (long)iVar3) {
          if (mask == (char *)0x0) {
            printf("%02x",(ulong)(byte)local_60[lVar8]);
          }
          else {
            if (pcVar7[lVar8] != '\0') {
              printf("%s","\x1b[30;1m");
            }
            printf("%02x",(ulong)(byte)local_60[lVar8]);
            if ((mask != (char *)0x0) && (pcVar7[lVar8] != '\0')) {
              printf("%s","\x1b[0m");
            }
          }
          iVar10 = iVar10 + 2;
          cVar1 = '\0';
        }
        if ((long)iVar3 <= lVar4 + lVar8) goto LAB_001017a7;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      cVar1 = '\a';
LAB_001017a7:
      if (cVar1 != '\a') goto LAB_001017de;
      putchar(0x20);
      iVar10 = iVar10 + 1;
      lVar9 = lVar9 + 1;
      local_60 = local_60 + 2;
      pcVar7 = pcVar7 + 2;
      lVar4 = lVar4 + 2;
    } while (lVar9 != 8);
    cVar1 = '\x04';
LAB_001017de:
    if ((cVar1 == '\x04') || (cVar1 == '\n')) {
      if (iVar10 < 0x29) {
        iVar10 = iVar10 + -0x29;
        do {
          putchar(0x20);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
      }
      lVar4 = 0;
      do {
        cVar1 = data[lVar4 + (int)uVar5];
        iVar2 = isprint((int)cVar1);
        iVar10 = (int)cVar1;
        if (iVar2 == 0) {
          iVar10 = 0x2e;
        }
        putchar(iVar10);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      putchar(10);
      uVar5 = uVar5 + 0x10;
      cVar1 = iVar3 <= (int)uVar5;
    }
    uVar6 = (ulong)uVar5;
    if (cVar1 != '\0') {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}